

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O0

int ipcmd_open_msq(ipcmd_t *ipcmd,int key,int creat)

{
  int iVar1;
  uint uVar2;
  uint local_20;
  int creat_local;
  int key_local;
  ipcmd_t *ipcmd_local;
  
  local_20 = creat;
  if (creat != 0) {
    local_20 = 0x200;
  }
  iVar1 = msgget(key,local_20 | 0x1b6);
  ipcmd->socket = iVar1;
  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  if (ipcmd->socket == -1) {
    ipcmd->connection_error = 1;
    ipcmd_local._4_4_ = -1;
  }
  else {
    uVar2 = getpid();
    ipcmd->pid = uVar2 & 0x7fff;
    if (local_20 != 0) {
      ipcmd->pid = 1;
    }
    ipcmd->connection_error = 0;
    ipcmd->send = ipcmd_send_msq;
    ipcmd->recv = ipcmd_recv_msq;
    ipcmd->flush = ipcmd_flush_msq;
    ipcmd->type = IPCMD_MSQ;
    ipcmd_local._4_4_ = 1;
  }
  return ipcmd_local._4_4_;
}

Assistant:

int ipcmd_open_msq(struct ipcmd_t* ipcmd, int key, int creat)
{
  if (creat)
    creat = IPC_CREAT;
  /* メッセージ・キューのオープン */
  ipcmd->socket = msgget(key, 0666 | creat);

  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  if (ipcmd->socket == -1)
  {
    ipcmd->connection_error = 1;
    return -1;
  }

  /* 内部データの初期化 */
  ipcmd->pid = 0x07fff & getpid();
  if (creat)
    ipcmd->pid = YPSPUR_MSG_CMD;
  ipcmd->connection_error = 0;
  ipcmd->send = ipcmd_send_msq;
  ipcmd->recv = ipcmd_recv_msq;
  ipcmd->flush = ipcmd_flush_msq;

  ipcmd->type = IPCMD_MSQ;

  return 1;
}